

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt__glTexSubImage1D(djg_texture *texture,GLenum target,GLint xoffset)

{
  GLsizei GVar1;
  PFNGLTEXSUBIMAGE1DPROC p_Var2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLint local_78;
  bool reset;
  djgt__glpss backup;
  GLint local_48 [2];
  djgt__glpss pus;
  GLint xoffset_local;
  GLenum target_local;
  djg_texture *texture_local;
  
  memset(local_48,0,0x24);
  pus[6] = 2;
  djgt__get_glpus(&local_78);
  iVar4 = memcmp(local_48,&local_78,0x24);
  if (iVar4 != 0) {
    djgt__set_glpus(local_48);
  }
  p_Var2 = glad_glTexSubImage1D;
  GVar1 = texture->x;
  GVar5 = djgt__glformat(texture->comp);
  GVar6 = djgt__gltype(texture->pf);
  (*p_Var2)(target,0,xoffset,GVar1,GVar5,GVar6,texture->texels);
  if (iVar4 != 0) {
    djgt__set_glpus(&local_78);
  }
  bVar3 = djgt__validate();
  return bVar3;
}

Assistant:

static bool
djgt__glTexSubImage1D(const djg_texture *texture, GLenum target, GLint xoffset)
{
    djgt__glpss pus = {0, 0, 0, 0, 0, 0 ,0, 0, 2};
    djgt__glpss backup;
    bool reset;

    djgt__get_glpus(backup);
    reset = memcmp(pus, backup, sizeof(pus)) != 0;
    if (reset) djgt__set_glpus(pus);
    glTexSubImage1D(target,
           /*level*/0,
                    xoffset,
                    texture->x,
                    djgt__glformat(texture->comp),
                    djgt__gltype(texture->pf),
                    texture->texels);
    if (reset) djgt__set_glpus(backup);

    return djgt__validate();
}